

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Index __thiscall wabt::Module::GetFuncTypeIndex(Module *this,FuncSignature *sig)

{
  bool bVar1;
  size_type sVar2;
  const_reference ppFVar3;
  ulong local_28;
  size_t i;
  FuncSignature *sig_local;
  Module *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>::size
                      (&this->func_types);
    if (sVar2 <= local_28) {
      return 0xffffffff;
    }
    ppFVar3 = std::vector<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>::operator[]
                        (&this->func_types,local_28);
    bVar1 = FuncSignature::operator==(&(*ppFVar3)->sig,sig);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return (Index)local_28;
}

Assistant:

Index Module::GetFuncTypeIndex(const FuncSignature& sig) const {
  for (size_t i = 0; i < func_types.size(); ++i) {
    if (func_types[i]->sig == sig) {
      return i;
    }
  }
  return kInvalidIndex;
}